

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qabstractitemview.cpp
# Opt level: O0

void QAbstractItemView::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  DragDropMode DVar4;
  DropAction DVar5;
  SelectionMode SVar6;
  SelectionBehavior SVar7;
  TextElideMode TVar8;
  ScrollMode SVar9;
  int iVar10;
  QMetaType QVar11;
  QSize QVar12;
  QtMocHelpers *in_RCX;
  ulong uVar13;
  uint in_EDX;
  int in_ESI;
  QAbstractItemView *in_RDI;
  long in_FS_OFFSET;
  void *_v_1;
  void *_v;
  QAbstractItemView *_t;
  undefined4 in_stack_fffffffffffffe98;
  QFlagsStorage<QAbstractItemView::EditTrigger> in_stack_fffffffffffffe9c;
  QModelIndex *in_stack_fffffffffffffea0;
  QModelIndex *in_stack_fffffffffffffea8;
  QModelIndex *pQVar14;
  EditTriggers actions;
  QAbstractItemView *in_stack_fffffffffffffeb0;
  undefined8 in_stack_fffffffffffffeb8;
  DragDropMode behavior;
  QAbstractItemView *in_stack_fffffffffffffec0;
  QMetaType local_60;
  QMetaTypeInterface *local_58;
  QMetaType local_50;
  QMetaTypeInterface *local_48;
  QMetaType local_40;
  QMetaTypeInterface *local_38;
  QMetaType local_30;
  QMetaType local_28;
  undefined1 local_20 [24];
  long local_8;
  
  behavior = (DragDropMode)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 0) {
    switch(in_EDX) {
    case 0:
      pressed((QAbstractItemView *)in_stack_fffffffffffffea0,
              (QModelIndex *)CONCAT44(in_stack_fffffffffffffe9c.i,in_stack_fffffffffffffe98));
      break;
    case 1:
      clicked((QAbstractItemView *)in_stack_fffffffffffffea0,
              (QModelIndex *)CONCAT44(in_stack_fffffffffffffe9c.i,in_stack_fffffffffffffe98));
      break;
    case 2:
      doubleClicked((QAbstractItemView *)in_stack_fffffffffffffea0,
                    (QModelIndex *)CONCAT44(in_stack_fffffffffffffe9c.i,in_stack_fffffffffffffe98));
      break;
    case 3:
      activated((QAbstractItemView *)in_stack_fffffffffffffea0,
                (QModelIndex *)CONCAT44(in_stack_fffffffffffffe9c.i,in_stack_fffffffffffffe98));
      break;
    case 4:
      entered((QAbstractItemView *)in_stack_fffffffffffffea0,
              (QModelIndex *)CONCAT44(in_stack_fffffffffffffe9c.i,in_stack_fffffffffffffe98));
      break;
    case 5:
      viewportEntered((QAbstractItemView *)0x811ac7);
      break;
    case 6:
      iconSizeChanged((QAbstractItemView *)in_stack_fffffffffffffea0,
                      (QSize *)CONCAT44(in_stack_fffffffffffffe9c.i,in_stack_fffffffffffffe98));
      break;
    case 7:
      (**(code **)(*(long *)&(in_RDI->super_QAbstractScrollArea).super_QFrame.super_QWidget + 0x210)
      )();
      break;
    case 8:
      (**(code **)(*(long *)&(in_RDI->super_QAbstractScrollArea).super_QFrame.super_QWidget + 0x218)
      )();
      break;
    case 9:
      (**(code **)(*(long *)&(in_RDI->super_QAbstractScrollArea).super_QFrame.super_QWidget + 0x220)
      )();
      break;
    case 10:
      (**(code **)(*(long *)&(in_RDI->super_QAbstractScrollArea).super_QFrame.super_QWidget + 0x228)
      )();
      break;
    case 0xb:
      edit((QAbstractItemView *)in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
      break;
    case 0xc:
      clearSelection((QAbstractItemView *)in_stack_fffffffffffffea0);
      break;
    case 0xd:
      setCurrentIndex(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      break;
    case 0xe:
      scrollToTop((QAbstractItemView *)in_stack_fffffffffffffea0);
      break;
    case 0xf:
      scrollToBottom(in_stack_fffffffffffffeb0);
      break;
    case 0x10:
      update((QAbstractItemView *)in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
      break;
    case 0x11:
      (**(code **)(*(long *)&(in_RDI->super_QAbstractScrollArea).super_QFrame.super_QWidget + 0x230)
      )(in_RDI,*(undefined8 *)(in_RCX + 8),*(undefined8 *)(in_RCX + 0x10));
      break;
    case 0x12:
      uVar1 = *(undefined8 *)(in_RCX + 8);
      uVar2 = *(undefined8 *)(in_RCX + 0x10);
      memset(local_20,0,0x18);
      QList<int>::QList((QList<int> *)0x811c68);
      (**(code **)(*(long *)&(in_RDI->super_QAbstractScrollArea).super_QFrame.super_QWidget + 0x230)
      )(in_RDI,uVar1,uVar2);
      QList<int>::~QList((QList<int> *)0x811c95);
      in_stack_fffffffffffffec0 = in_RDI;
      break;
    case 0x13:
      (**(code **)(*(long *)&(in_RDI->super_QAbstractScrollArea).super_QFrame.super_QWidget + 0x238)
      )(in_RDI,*(undefined8 *)(in_RCX + 8),**(undefined4 **)(in_RCX + 0x10));
      break;
    case 0x14:
      (**(code **)(*(long *)&(in_RDI->super_QAbstractScrollArea).super_QFrame.super_QWidget + 0x240)
      )(in_RDI,*(undefined8 *)(in_RCX + 8),**(undefined4 **)(in_RCX + 0x10));
      break;
    case 0x15:
      (**(code **)(*(long *)&(in_RDI->super_QAbstractScrollArea).super_QFrame.super_QWidget + 0x248)
      )(in_RDI,*(undefined8 *)(in_RCX + 8),*(undefined8 *)(in_RCX + 0x10));
      break;
    case 0x16:
      (**(code **)(*(long *)&(in_RDI->super_QAbstractScrollArea).super_QFrame.super_QWidget + 0x250)
      )(in_RDI,*(undefined8 *)(in_RCX + 8),*(undefined8 *)(in_RCX + 0x10));
      break;
    case 0x17:
      (**(code **)(*(long *)&(in_RDI->super_QAbstractScrollArea).super_QFrame.super_QWidget + 600))
                ();
      break;
    case 0x18:
      (**(code **)(*(long *)&(in_RDI->super_QAbstractScrollArea).super_QFrame.super_QWidget + 0x260)
      )();
      break;
    case 0x19:
      (**(code **)(*(long *)&(in_RDI->super_QAbstractScrollArea).super_QFrame.super_QWidget + 0x268)
      )();
      break;
    case 0x1a:
      (**(code **)(*(long *)&(in_RDI->super_QAbstractScrollArea).super_QFrame.super_QWidget + 0x270)
      )();
      break;
    case 0x1b:
      (**(code **)(*(long *)&(in_RDI->super_QAbstractScrollArea).super_QFrame.super_QWidget + 0x278)
      )();
      break;
    case 0x1c:
      (**(code **)(*(long *)&(in_RDI->super_QAbstractScrollArea).super_QFrame.super_QWidget + 0x280)
      )();
      break;
    case 0x1d:
      (**(code **)(*(long *)&(in_RDI->super_QAbstractScrollArea).super_QFrame.super_QWidget + 0x288)
      )();
      break;
    case 0x1e:
      (**(code **)(*(long *)&(in_RDI->super_QAbstractScrollArea).super_QFrame.super_QWidget + 0x290)
      )(in_RDI,**(undefined8 **)(in_RCX + 8),**(undefined4 **)(in_RCX + 0x10));
      break;
    case 0x1f:
      (**(code **)(*(long *)&(in_RDI->super_QAbstractScrollArea).super_QFrame.super_QWidget + 0x298)
      )();
      break;
    case 0x20:
      (**(code **)(*(long *)&(in_RDI->super_QAbstractScrollArea).super_QFrame.super_QWidget + 0x2a0)
      )();
    }
  }
  if (in_ESI == 7) {
    uVar13 = (ulong)(in_EDX - 0x11);
    switch(uVar13) {
    case 0:
      if (**(int **)(in_RCX + 8) == 2) {
        local_38 = (QMetaTypeInterface *)QMetaType::fromType<QList<int>>();
        behavior = (DragDropMode)(uVar13 >> 0x20);
        **(undefined8 **)in_RCX = local_38;
      }
      else {
        memset(&local_30,0,8);
        behavior = (DragDropMode)(uVar13 >> 0x20);
        QMetaType::QMetaType(&local_30);
        **(undefined8 **)in_RCX = local_30.d_ptr;
      }
      break;
    default:
      memset(&local_28,0,8);
      behavior = (DragDropMode)(uVar13 >> 0x20);
      QMetaType::QMetaType(&local_28);
      **(undefined8 **)in_RCX = local_28.d_ptr;
      break;
    case 4:
      if (**(uint **)(in_RCX + 8) < 2) {
        local_48 = (QMetaTypeInterface *)QMetaType::fromType<QItemSelection>();
        behavior = (DragDropMode)(uVar13 >> 0x20);
        **(undefined8 **)in_RCX = local_48;
      }
      else {
        memset(&local_40,0,8);
        behavior = (DragDropMode)(uVar13 >> 0x20);
        QMetaType::QMetaType(&local_40);
        **(undefined8 **)in_RCX = local_40.d_ptr;
      }
      break;
    case 0xd:
      if (**(int **)(in_RCX + 8) == 0) {
        local_58 = (QMetaTypeInterface *)QMetaType::fromType<QWidget*>();
        behavior = (DragDropMode)(uVar13 >> 0x20);
        **(undefined8 **)in_RCX = local_58;
      }
      else {
        memset(&local_50,0,8);
        behavior = (DragDropMode)(uVar13 >> 0x20);
        QMetaType::QMetaType(&local_50);
        **(undefined8 **)in_RCX = local_50.d_ptr;
      }
      break;
    case 0xe:
      if (**(int **)(in_RCX + 8) == 0) {
        QVar11 = QMetaType::fromType<QWidget*>();
        behavior = (DragDropMode)(uVar13 >> 0x20);
        **(undefined8 **)in_RCX = QVar11.d_ptr;
      }
      else {
        memset(&local_60,0,8);
        behavior = (DragDropMode)(uVar13 >> 0x20);
        QMetaType::QMetaType(&local_60);
        **(undefined8 **)in_RCX = local_60.d_ptr;
      }
    }
  }
  if ((in_ESI != 5) ||
     ((((bVar3 = QtMocHelpers::indexOfMethod<void(QAbstractItemView::*)(QModelIndex_const&)>
                           (in_RCX,(void **)pressed,0,0), !bVar3 &&
        (bVar3 = QtMocHelpers::indexOfMethod<void(QAbstractItemView::*)(QModelIndex_const&)>
                           (in_RCX,(void **)clicked,0,1), !bVar3)) &&
       (bVar3 = QtMocHelpers::indexOfMethod<void(QAbstractItemView::*)(QModelIndex_const&)>
                          (in_RCX,(void **)doubleClicked,0,2), !bVar3)) &&
      (((bVar3 = QtMocHelpers::indexOfMethod<void(QAbstractItemView::*)(QModelIndex_const&)>
                           (in_RCX,(void **)activated,0,3), !bVar3 &&
        (bVar3 = QtMocHelpers::indexOfMethod<void(QAbstractItemView::*)(QModelIndex_const&)>
                           (in_RCX,(void **)entered,0,4), !bVar3)) &&
       ((bVar3 = QtMocHelpers::indexOfMethod<void(QAbstractItemView::*)()>
                           (in_RCX,(void **)viewportEntered,0,5), !bVar3 &&
        (bVar3 = QtMocHelpers::indexOfMethod<void(QAbstractItemView::*)(QSize_const&)>
                           (in_RCX,(void **)iconSizeChanged,0,6), !bVar3)))))))) {
    if (in_ESI == 1) {
      pQVar14 = *(QModelIndex **)in_RCX;
      in_stack_fffffffffffffeb0 = (QAbstractItemView *)(ulong)in_EDX;
      switch(in_stack_fffffffffffffeb0) {
      case (QAbstractItemView *)0x0:
        bVar3 = hasAutoScroll((QAbstractItemView *)in_stack_fffffffffffffea0);
        *(bool *)&((Representation *)&pQVar14->r)->m_i = bVar3;
        break;
      case (QAbstractItemView *)0x1:
        iVar10 = autoScrollMargin((QAbstractItemView *)in_stack_fffffffffffffea0);
        ((Representation *)&pQVar14->r)->m_i = iVar10;
        break;
      case (QAbstractItemView *)0x2:
        editTriggers((QAbstractItemView *)in_stack_fffffffffffffea0);
        QtMocHelpers::assignFlags<QFlags<QAbstractItemView::EditTrigger>>
                  ((void *)0x81239a,
                   (QFlags<QAbstractItemView::EditTrigger>)in_stack_fffffffffffffe9c.i);
        in_stack_fffffffffffffea8 = pQVar14;
        break;
      case (QAbstractItemView *)0x3:
        bVar3 = tabKeyNavigation((QAbstractItemView *)in_stack_fffffffffffffea0);
        *(bool *)&((Representation *)&pQVar14->r)->m_i = bVar3;
        break;
      case (QAbstractItemView *)0x4:
        bVar3 = showDropIndicator((QAbstractItemView *)in_stack_fffffffffffffea0);
        *(bool *)&((Representation *)&pQVar14->r)->m_i = bVar3;
        break;
      case (QAbstractItemView *)0x5:
        bVar3 = dragEnabled((QAbstractItemView *)in_stack_fffffffffffffea0);
        *(bool *)&((Representation *)&pQVar14->r)->m_i = bVar3;
        break;
      case (QAbstractItemView *)0x6:
        bVar3 = dragDropOverwriteMode((QAbstractItemView *)in_stack_fffffffffffffea0);
        *(bool *)&((Representation *)&pQVar14->r)->m_i = bVar3;
        break;
      case (QAbstractItemView *)0x7:
        DVar4 = dragDropMode((QAbstractItemView *)in_stack_fffffffffffffea8);
        ((Representation *)&pQVar14->r)->m_i = DVar4;
        break;
      case (QAbstractItemView *)0x8:
        DVar5 = defaultDropAction((QAbstractItemView *)in_stack_fffffffffffffea0);
        ((Representation *)&pQVar14->r)->m_i = DVar5;
        break;
      case (QAbstractItemView *)0x9:
        bVar3 = alternatingRowColors((QAbstractItemView *)in_stack_fffffffffffffea0);
        *(bool *)&((Representation *)&pQVar14->r)->m_i = bVar3;
        break;
      case (QAbstractItemView *)0xa:
        SVar6 = selectionMode((QAbstractItemView *)in_stack_fffffffffffffea0);
        ((Representation *)&pQVar14->r)->m_i = SVar6;
        break;
      case (QAbstractItemView *)0xb:
        SVar7 = selectionBehavior((QAbstractItemView *)in_stack_fffffffffffffea0);
        ((Representation *)&pQVar14->r)->m_i = SVar7;
        break;
      case (QAbstractItemView *)0xc:
        QVar12 = iconSize((QAbstractItemView *)in_stack_fffffffffffffea0);
        pQVar14->r = QVar12.wd.m_i;
        pQVar14->c = QVar12.ht.m_i;
        break;
      case (QAbstractItemView *)0xd:
        TVar8 = textElideMode((QAbstractItemView *)0x8124d5);
        ((Representation *)&pQVar14->r)->m_i = TVar8;
        break;
      case (QAbstractItemView *)0xe:
        SVar9 = verticalScrollMode((QAbstractItemView *)in_stack_fffffffffffffea0);
        ((Representation *)&pQVar14->r)->m_i = SVar9;
        break;
      case (QAbstractItemView *)0xf:
        SVar9 = horizontalScrollMode((QAbstractItemView *)in_stack_fffffffffffffea0);
        ((Representation *)&pQVar14->r)->m_i = SVar9;
        break;
      case (QAbstractItemView *)0x10:
        iVar10 = updateThreshold((QAbstractItemView *)in_stack_fffffffffffffea0);
        ((Representation *)&pQVar14->r)->m_i = iVar10;
      }
    }
    if (in_ESI == 2) {
      in_stack_fffffffffffffea0 = (QModelIndex *)(ulong)in_EDX;
      bVar3 = SUB41(in_stack_fffffffffffffe9c.i >> 0x18,0);
      actions.super_QFlagsStorageHelper<QAbstractItemView::EditTrigger,_4>.
      super_QFlagsStorage<QAbstractItemView::EditTrigger>.i =
           SUB84((ulong)in_stack_fffffffffffffea8 >> 0x20,0);
      switch(in_stack_fffffffffffffea0) {
      case (QModelIndex *)0x0:
        setAutoScroll((QAbstractItemView *)in_stack_fffffffffffffea0,bVar3);
        break;
      case (QModelIndex *)0x1:
        setAutoScrollMargin((QAbstractItemView *)in_stack_fffffffffffffea0,
                            in_stack_fffffffffffffe9c.i);
        break;
      case (QModelIndex *)0x2:
        setEditTriggers((QAbstractItemView *)in_stack_fffffffffffffea0,actions);
        break;
      case (QModelIndex *)0x3:
        setTabKeyNavigation((QAbstractItemView *)in_stack_fffffffffffffea0,bVar3);
        break;
      case (QModelIndex *)0x4:
        setDropIndicatorShown((QAbstractItemView *)in_stack_fffffffffffffea0,bVar3);
        break;
      case (QModelIndex *)0x5:
        setDragEnabled((QAbstractItemView *)in_stack_fffffffffffffea0,bVar3);
        break;
      case (QModelIndex *)0x6:
        setDragDropOverwriteMode((QAbstractItemView *)in_stack_fffffffffffffea0,bVar3);
        break;
      case (QModelIndex *)0x7:
        setDragDropMode(in_stack_fffffffffffffec0,behavior);
        break;
      case (QModelIndex *)0x8:
        setDefaultDropAction
                  ((QAbstractItemView *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c.i);
        break;
      case (QModelIndex *)0x9:
        setAlternatingRowColors
                  (in_stack_fffffffffffffeb0,SUB81((ulong)in_stack_fffffffffffffea8 >> 0x38,0));
        break;
      case (QModelIndex *)0xa:
        setSelectionMode((QAbstractItemView *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c.i)
        ;
        break;
      case (QModelIndex *)0xb:
        setSelectionBehavior
                  ((QAbstractItemView *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c.i);
        break;
      case (QModelIndex *)0xc:
        setIconSize(in_stack_fffffffffffffeb0,(QSize *)in_stack_fffffffffffffea8);
        break;
      case (QModelIndex *)0xd:
        setTextElideMode((QAbstractItemView *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c.i)
        ;
        break;
      case (QModelIndex *)0xe:
        setVerticalScrollMode((QAbstractItemView *)in_stack_fffffffffffffea8,ScrollPerItem);
        break;
      case (QModelIndex *)0xf:
        setHorizontalScrollMode
                  (in_stack_fffffffffffffeb0,
                   (ScrollMode)
                   actions.super_QFlagsStorageHelper<QAbstractItemView::EditTrigger,_4>.
                   super_QFlagsStorage<QAbstractItemView::EditTrigger>.i);
        break;
      case (QModelIndex *)0x10:
        setUpdateThreshold((QAbstractItemView *)in_stack_fffffffffffffea0,
                           in_stack_fffffffffffffe9c.i);
      }
    }
    if (in_ESI == 3) {
      if (in_EDX == 0xe) {
        resetVerticalScrollMode((QAbstractItemView *)in_stack_fffffffffffffea0);
      }
      else if (in_EDX == 0xf) {
        resetHorizontalScrollMode((QAbstractItemView *)in_stack_fffffffffffffea0);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemView::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QAbstractItemView *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->pressed((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 1: _t->clicked((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 2: _t->doubleClicked((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 3: _t->activated((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 4: _t->entered((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 5: _t->viewportEntered(); break;
        case 6: _t->iconSizeChanged((*reinterpret_cast< std::add_pointer_t<QSize>>(_a[1]))); break;
        case 7: _t->reset(); break;
        case 8: _t->setRootIndex((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 9: _t->doItemsLayout(); break;
        case 10: _t->selectAll(); break;
        case 11: _t->edit((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 12: _t->clearSelection(); break;
        case 13: _t->setCurrentIndex((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 14: _t->scrollToTop(); break;
        case 15: _t->scrollToBottom(); break;
        case 16: _t->update((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 17: _t->dataChanged((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QList<int>>>(_a[3]))); break;
        case 18: _t->dataChanged((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[2]))); break;
        case 19: _t->rowsInserted((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3]))); break;
        case 20: _t->rowsAboutToBeRemoved((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3]))); break;
        case 21: _t->selectionChanged((*reinterpret_cast< std::add_pointer_t<QItemSelection>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QItemSelection>>(_a[2]))); break;
        case 22: _t->currentChanged((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[2]))); break;
        case 23: _t->updateEditorData(); break;
        case 24: _t->updateEditorGeometries(); break;
        case 25: _t->updateGeometries(); break;
        case 26: _t->verticalScrollbarAction((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 27: _t->horizontalScrollbarAction((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 28: _t->verticalScrollbarValueChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 29: _t->horizontalScrollbarValueChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 30: _t->closeEditor((*reinterpret_cast< std::add_pointer_t<QWidget*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAbstractItemDelegate::EndEditHint>>(_a[2]))); break;
        case 31: _t->commitData((*reinterpret_cast< std::add_pointer_t<QWidget*>>(_a[1]))); break;
        case 32: _t->editorDestroyed((*reinterpret_cast< std::add_pointer_t<QObject*>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 17:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 2:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QList<int> >(); break;
            }
            break;
        case 21:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 1:
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QItemSelection >(); break;
            }
            break;
        case 30:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QWidget* >(); break;
            }
            break;
        case 31:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QWidget* >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemView::*)(const QModelIndex & )>(_a, &QAbstractItemView::pressed, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemView::*)(const QModelIndex & )>(_a, &QAbstractItemView::clicked, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemView::*)(const QModelIndex & )>(_a, &QAbstractItemView::doubleClicked, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemView::*)(const QModelIndex & )>(_a, &QAbstractItemView::activated, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemView::*)(const QModelIndex & )>(_a, &QAbstractItemView::entered, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemView::*)()>(_a, &QAbstractItemView::viewportEntered, 5))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemView::*)(const QSize & )>(_a, &QAbstractItemView::iconSizeChanged, 6))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<bool*>(_v) = _t->hasAutoScroll(); break;
        case 1: *reinterpret_cast<int*>(_v) = _t->autoScrollMargin(); break;
        case 2: QtMocHelpers::assignFlags<EditTriggers>(_v, _t->editTriggers()); break;
        case 3: *reinterpret_cast<bool*>(_v) = _t->tabKeyNavigation(); break;
        case 4: *reinterpret_cast<bool*>(_v) = _t->showDropIndicator(); break;
        case 5: *reinterpret_cast<bool*>(_v) = _t->dragEnabled(); break;
        case 6: *reinterpret_cast<bool*>(_v) = _t->dragDropOverwriteMode(); break;
        case 7: *reinterpret_cast<DragDropMode*>(_v) = _t->dragDropMode(); break;
        case 8: *reinterpret_cast<Qt::DropAction*>(_v) = _t->defaultDropAction(); break;
        case 9: *reinterpret_cast<bool*>(_v) = _t->alternatingRowColors(); break;
        case 10: *reinterpret_cast<SelectionMode*>(_v) = _t->selectionMode(); break;
        case 11: *reinterpret_cast<SelectionBehavior*>(_v) = _t->selectionBehavior(); break;
        case 12: *reinterpret_cast<QSize*>(_v) = _t->iconSize(); break;
        case 13: *reinterpret_cast<Qt::TextElideMode*>(_v) = _t->textElideMode(); break;
        case 14: *reinterpret_cast<ScrollMode*>(_v) = _t->verticalScrollMode(); break;
        case 15: *reinterpret_cast<ScrollMode*>(_v) = _t->horizontalScrollMode(); break;
        case 16: *reinterpret_cast<int*>(_v) = _t->updateThreshold(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setAutoScroll(*reinterpret_cast<bool*>(_v)); break;
        case 1: _t->setAutoScrollMargin(*reinterpret_cast<int*>(_v)); break;
        case 2: _t->setEditTriggers(*reinterpret_cast<EditTriggers*>(_v)); break;
        case 3: _t->setTabKeyNavigation(*reinterpret_cast<bool*>(_v)); break;
        case 4: _t->setDropIndicatorShown(*reinterpret_cast<bool*>(_v)); break;
        case 5: _t->setDragEnabled(*reinterpret_cast<bool*>(_v)); break;
        case 6: _t->setDragDropOverwriteMode(*reinterpret_cast<bool*>(_v)); break;
        case 7: _t->setDragDropMode(*reinterpret_cast<DragDropMode*>(_v)); break;
        case 8: _t->setDefaultDropAction(*reinterpret_cast<Qt::DropAction*>(_v)); break;
        case 9: _t->setAlternatingRowColors(*reinterpret_cast<bool*>(_v)); break;
        case 10: _t->setSelectionMode(*reinterpret_cast<SelectionMode*>(_v)); break;
        case 11: _t->setSelectionBehavior(*reinterpret_cast<SelectionBehavior*>(_v)); break;
        case 12: _t->setIconSize(*reinterpret_cast<QSize*>(_v)); break;
        case 13: _t->setTextElideMode(*reinterpret_cast<Qt::TextElideMode*>(_v)); break;
        case 14: _t->setVerticalScrollMode(*reinterpret_cast<ScrollMode*>(_v)); break;
        case 15: _t->setHorizontalScrollMode(*reinterpret_cast<ScrollMode*>(_v)); break;
        case 16: _t->setUpdateThreshold(*reinterpret_cast<int*>(_v)); break;
        default: break;
        }
    }
if (_c == QMetaObject::ResetProperty) {
        switch (_id) {
        case 14: _t->resetVerticalScrollMode(); break;
        case 15: _t->resetHorizontalScrollMode(); break;
        default: break;
        }
    }
}